

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkyu(fitsfile *fptr,char *keyname,char *comm,int *status)

{
  char local_d8 [8];
  char card [81];
  char local_78 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x10000077 = status;
    strcpy(local_78," ");
    ffmkky(keyname,local_78,comm,local_d8,stack0xffffffffffffffd0);
    ffprec(fptr,local_d8,stack0xffffffffffffffd0);
    fptr_local._4_4_ = *stack0xffffffffffffffd0;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpkyu( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            const char *comm,   /* I - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Write (put) a null-valued keyword and comment into the FITS header.  
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring," ");  /* create a dummy value string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword */
    ffprec(fptr, card, status);

    return(*status);
}